

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O0

string * __thiscall
glcts::DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,DrawElementsBaseVertexTestBase *this,
          _function_type function_type)

{
  bool bVar1;
  ContextType CVar2;
  RenderContext *pRVar3;
  TestError *this_00;
  allocator<char> local_1e;
  undefined1 local_1d;
  _function_type local_1c;
  DrawElementsBaseVertexTestBase *pDStack_18;
  _function_type function_type_local;
  DrawElementsBaseVertexTestBase *this_local;
  string *result;
  
  local_1d = 0;
  local_1c = function_type;
  pDStack_18 = this;
  this_local = (DrawElementsBaseVertexTestBase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[?]",&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  switch(local_1c) {
  case FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX:
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    CVar2.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    bVar1 = glu::isContextTypeES(CVar2);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"glDrawElementsBaseVertexEXT()");
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,"glDrawElementsBaseVertex()")
      ;
    }
    break;
  case FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX:
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    CVar2.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    bVar1 = glu::isContextTypeES(CVar2);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"glDrawElementsInstancedBaseVertexEXT()");
    }
    else {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"glDrawElementsInstancedBaseVertex()");
    }
    break;
  case FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX:
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    CVar2.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    bVar1 = glu::isContextTypeES(CVar2);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"glDrawRangeElementsBaseVertexEXT()");
    }
    else {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"glDrawRangeElementsBaseVertex()");
    }
    break;
  case FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX:
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    CVar2.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    bVar1 = glu::isContextTypeES(CVar2);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"glMultiDrawElementsBaseVertexEXT()");
    }
    else {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"glMultiDrawElementsBaseVertex()");
    }
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unknown function type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
               ,0x393);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DrawElementsBaseVertexTestBase::getFunctionName(_function_type function_type)
{
	std::string result = "[?]";

	switch (function_type)
	{
	case FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glDrawElementsBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glDrawElementsBaseVertex()";

			break;
		}

		break;
	}

	case FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glDrawElementsInstancedBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glDrawElementsInstancedBaseVertex()";

			break;
		}

		break;
	}

	case FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glDrawRangeElementsBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glDrawRangeElementsBaseVertex()";

			break;
		}

		break;
	}

	case FUNCTION_GL_MULTI_DRAW_ELEMENTS_BASE_VERTEX:
	{
		if (glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			result = "glMultiDrawElementsBaseVertexEXT()";

			break;
		}
		else
		{
			result = "glMultiDrawElementsBaseVertex()";

			break;
		}

		break;
	}

	default:
	{
		TCU_FAIL("Unknown function type");

		break;
	}
	} /* switch (function_type) */

	return result;
}